

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

gs_val_t *
gs_c_fn_vec3_distance(gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals)

{
  float fVar1;
  gs_val_t sig;
  gs_val_type signature_arg_types [2];
  gs_val_t local_38;
  gs_val_type local_20 [2];
  
  local_20[0] = GS_VAL_VEC3;
  local_20[1] = GS_VAL_VEC3;
  gs_c_fn_signature(&local_38,eval,vals,num_vals,local_20,2);
  if (local_38.is_return == true) {
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38.field_2._8_8_;
    __return_storage_ptr__->type = local_38.type;
    __return_storage_ptr__->is_return = (_Bool)local_38.is_return;
    *(int3 *)&__return_storage_ptr__->field_0x5 = local_38._5_3_;
    (__return_storage_ptr__->field_2).vec2_val = local_38.field_2.vec2_val;
  }
  else {
    fVar1 = vec3_distance((vals->field_2).vec3_val,vals[1].field_2.vec3_val);
    __return_storage_ptr__->type = GS_VAL_FLOAT;
    __return_storage_ptr__->is_return = false;
    (__return_storage_ptr__->field_2).float_val = fVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_c_fn_vec3_distance(gs_eval_t *eval, gs_val_t *vals, int num_vals) {
    gs_val_type signature_arg_types[] = { GS_VAL_VEC3, GS_VAL_VEC3 };
    int signature_arg_count = sizeof(signature_arg_types) / sizeof(signature_arg_types[0]);;
    gs_val_t sig = gs_c_fn_signature(eval, vals, num_vals, signature_arg_types, signature_arg_count);
    if (sig.is_return) return sig;

    return gs_val_float(vec3_distance(vals[0].vec3_val, vals[1].vec3_val));
}